

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClassCP
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<unsigned_int> *result,
          codepoint_t baseOffset)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  Char lc;
  uint index;
  int j;
  long lVar7;
  codepoint_t local_68 [2];
  codepoint_t equivs [4];
  uint acth;
  uint local_34 [2];
  uint tblidx;
  
  local_34[0] = 0;
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    index = 0;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (4 < (this->rep).compact.countPlusOne - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      if (*(int *)&this->rep - 1U <= index) break;
      uVar4 = GetCompactCharU(this,index);
      uVar5 = GetCompactCharU(this,index);
      bVar3 = CaseInsensitive::RangeToEquivClass
                        (local_34,uVar4 + baseOffset,uVar5 + baseOffset,equivs + 3,local_68);
      if (bVar3) {
        lVar7 = 0;
        do {
          CharSet<unsigned_int>::SetRange(result,allocator,local_68[lVar7],local_68[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
      else {
        uVar4 = GetCompactCharU(this,index);
        lc = (uVar4 & 0xffff) + baseOffset;
        CharSet<unsigned_int>::SetRange(result,allocator,lc,lc);
      }
      index = index + 1;
    }
  }
  else {
    CharBitvec::ToEquivClass<unsigned_int>
              (&(this->rep).full.direct,allocator,0,local_34,result,baseOffset);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[8])(pCVar1,allocator,2,0,local_34,result,baseOffset);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClassCP(ArenaAllocator* allocator, CharSet<codepoint_t>& result, codepoint_t baseOffset)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i) + baseOffset, this->GetCompactCharU(i) + baseOffset, acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i) + baseOffset);
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<codepoint_t>(allocator, 0, tblidx, result, baseOffset);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassCP(allocator, CharSetNode::levels - 1, 0, tblidx, result, baseOffset);
            }
        }
    }